

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void fmt::v11::detail::format_dragon
               (basic_fp<unsigned___int128> value,uint flags,int num_digits,buffer<char> *buf,
               int *exp10)

{
  uint *puVar1;
  uint *puVar2;
  uint *puVar3;
  char *pcVar4;
  uint *puVar5;
  undefined1 n [16];
  undefined1 n_00 [16];
  undefined1 value_00 [16];
  uint uVar6;
  int iVar7;
  ulong uVar8;
  bigint *lhs2;
  size_t sVar9;
  runtime_error *this;
  byte bVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  uint uVar14;
  bigint *this_00;
  long lVar15;
  bigint denominator;
  bigint numerator;
  bigint lower;
  bigint upper_store;
  undefined8 in_stack_fffffffffffffcd8;
  undefined4 uVar16;
  undefined4 in_stack_fffffffffffffce4;
  undefined4 uVar17;
  bigint local_2d0;
  bigint local_228;
  bigint local_180;
  bigint local_d8;
  
  local_228.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_228.bigits_.super_buffer<unsigned_int>.grow_ =
       basic_memory_buffer<unsigned_int,_32UL,_fmt::v11::detail::allocator<unsigned_int>_>::grow;
  puVar1 = local_228.bigits_.store_;
  local_228.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_228.exp_ = 0;
  local_2d0.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_2d0.bigits_.super_buffer<unsigned_int>.grow_ =
       basic_memory_buffer<unsigned_int,_32UL,_fmt::v11::detail::allocator<unsigned_int>_>::grow;
  puVar2 = local_2d0.bigits_.store_;
  local_2d0.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_2d0.exp_ = 0;
  local_180.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_180.bigits_.super_buffer<unsigned_int>.grow_ =
       basic_memory_buffer<unsigned_int,_32UL,_fmt::v11::detail::allocator<unsigned_int>_>::grow;
  puVar3 = local_180.bigits_.store_;
  local_180.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_180.exp_ = 0;
  this_00 = &local_d8;
  local_d8.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_d8.bigits_.super_buffer<unsigned_int>.grow_ =
       basic_memory_buffer<unsigned_int,_32UL,_fmt::v11::detail::allocator<unsigned_int>_>::grow;
  puVar5 = local_d8.bigits_.store_;
  local_d8.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_d8.exp_ = 0;
  iVar13 = (flags & 1) + 1;
  local_2d0.bigits_.super_buffer<unsigned_int>.ptr_ = puVar2;
  local_228.bigits_.super_buffer<unsigned_int>.ptr_ = puVar1;
  local_180.bigits_.super_buffer<unsigned_int>.ptr_ = puVar3;
  local_d8.bigits_.super_buffer<unsigned_int>.ptr_ = puVar5;
  if (value.e < 0) {
    if (*exp10 < 0) {
      bigint::assign_pow10(&local_228,-*exp10);
      bigint::assign(&local_180,&local_228);
      if ((flags & 1) == 0) {
        this_00 = (bigint *)0x0;
      }
      else {
        this_00 = &local_d8;
        bigint::assign(this_00,&local_228);
        bigint::operator<<=(this_00,1);
      }
      value_00._8_4_ = flags;
      value_00._0_8_ = in_stack_fffffffffffffcd8;
      value_00._12_4_ = in_stack_fffffffffffffce4;
      bigint::multiply<unsigned___int128,_0>(&local_228,(unsigned___int128)value_00);
      bigint::operator<<=(&local_228,iVar13);
      *local_2d0.bigits_.super_buffer<unsigned_int>.ptr_ = 1;
      uVar8 = 1;
      if (local_2d0.bigits_.super_buffer<unsigned_int>.capacity_ == 0) {
        (*local_2d0.bigits_.super_buffer<unsigned_int>.grow_)((buffer<unsigned_int> *)&local_2d0,1);
        uVar8 = (ulong)(local_2d0.bigits_.super_buffer<unsigned_int>.capacity_ != 0);
      }
      local_2d0.exp_ = 0;
      local_2d0.bigits_.super_buffer<unsigned_int>.size_ = uVar8;
      bigint::operator<<=(&local_2d0,iVar13 - value.e);
    }
    else {
      n_00._8_4_ = flags;
      n_00._0_8_ = in_stack_fffffffffffffcd8;
      n_00._12_4_ = in_stack_fffffffffffffce4;
      bigint::assign<unsigned___int128,_0>(&local_228,(unsigned___int128)n_00);
      bigint::operator<<=(&local_228,iVar13);
      bigint::assign_pow10(&local_2d0,*exp10);
      bigint::operator<<=(&local_2d0,iVar13 - value.e);
      *local_180.bigits_.super_buffer<unsigned_int>.ptr_ = 1;
      uVar8 = 1;
      if (local_180.bigits_.super_buffer<unsigned_int>.capacity_ == 0) {
        (*local_180.bigits_.super_buffer<unsigned_int>.grow_)((buffer<unsigned_int> *)&local_180,1);
        uVar8 = (ulong)(local_180.bigits_.super_buffer<unsigned_int>.capacity_ != 0);
      }
      local_180.exp_ = 0;
      local_180.bigits_.super_buffer<unsigned_int>.size_ = uVar8;
      if ((flags & 1) == 0) {
        this_00 = (bigint *)0x0;
      }
      else {
        *local_d8.bigits_.super_buffer<unsigned_int>.ptr_ = 2;
        uVar8 = 1;
        if (local_d8.bigits_.super_buffer<unsigned_int>.capacity_ == 0) {
          (*local_d8.bigits_.super_buffer<unsigned_int>.grow_)((buffer<unsigned_int> *)&local_d8,1);
          uVar8 = (ulong)(local_d8.bigits_.super_buffer<unsigned_int>.capacity_ != 0);
        }
        local_d8.exp_ = 0;
        local_d8.bigits_.super_buffer<unsigned_int>.size_ = uVar8;
      }
    }
  }
  else {
    n._8_4_ = flags;
    n._0_8_ = in_stack_fffffffffffffcd8;
    n._12_4_ = in_stack_fffffffffffffce4;
    bigint::assign<unsigned___int128,_0>(&local_228,(unsigned___int128)n);
    bigint::operator<<=(&local_228,value.e + iVar13);
    *local_180.bigits_.super_buffer<unsigned_int>.ptr_ = 1;
    uVar8 = 1;
    if (local_180.bigits_.super_buffer<unsigned_int>.capacity_ == 0) {
      (*local_180.bigits_.super_buffer<unsigned_int>.grow_)((buffer<unsigned_int> *)&local_180,1);
      uVar8 = (ulong)(local_180.bigits_.super_buffer<unsigned_int>.capacity_ != 0);
    }
    local_180.exp_ = 0;
    local_180.bigits_.super_buffer<unsigned_int>.size_ = uVar8;
    bigint::operator<<=(&local_180,value.e);
    if ((flags & 1) == 0) {
      this_00 = (bigint *)0x0;
    }
    else {
      *local_d8.bigits_.super_buffer<unsigned_int>.ptr_ = 1;
      uVar8 = 1;
      if (local_d8.bigits_.super_buffer<unsigned_int>.capacity_ == 0) {
        (*local_d8.bigits_.super_buffer<unsigned_int>.grow_)((buffer<unsigned_int> *)&local_d8,1);
        uVar8 = (ulong)(local_d8.bigits_.super_buffer<unsigned_int>.capacity_ != 0);
      }
      this_00 = &local_d8;
      local_d8.exp_ = 0;
      local_d8.bigits_.super_buffer<unsigned_int>.size_ = uVar8;
      bigint::operator<<=(this_00,value.e + 1);
    }
    bigint::assign_pow10(&local_2d0,*exp10);
    bigint::operator<<=(&local_2d0,iVar13);
  }
  uVar11 = ~(uint)value.f & 1;
  lhs2 = &local_180;
  if (this_00 != (bigint *)0x0) {
    lhs2 = this_00;
  }
  uVar14 = num_digits;
  if ((flags & 2) != 0) {
    iVar13 = add_compare(&local_228,lhs2,&local_2d0);
    if (iVar13 + uVar11 == 0 || SCARRY4(iVar13,uVar11) != (int)(iVar13 + uVar11) < 0) {
      *exp10 = *exp10 + -1;
      bigint::multiply(&local_228,10);
      if (num_digits < 0) {
        bigint::multiply(&local_180,10);
        if (this_00 != (bigint *)0x0) {
          bigint::multiply(this_00,10);
        }
      }
    }
    if ((flags & 4) != 0) {
      iVar13 = *exp10;
      if (0x7ffffffe - iVar13 < num_digits && -1 < iVar13) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"number is too big");
        *(undefined ***)this = &PTR__runtime_error_005c2bf8;
        __cxa_throw(this,&format_error::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar14 = num_digits + iVar13 + 1;
    }
  }
  if (-1 < num_digits) {
    uVar11 = uVar14 - 1;
    *exp10 = *exp10 - uVar11;
    if ((int)uVar14 < 1) {
      bVar10 = 0x30;
      if (uVar14 == 0) {
        bigint::multiply(&local_2d0,10);
        iVar13 = add_compare(&local_228,&local_228,&local_2d0);
        bVar10 = 0 < iVar13 | 0x30;
      }
      sVar9 = buf->size_;
      uVar8 = sVar9 + 1;
      if (buf->capacity_ < uVar8) {
        (*buf->grow_)(buf,uVar8);
        sVar9 = buf->size_;
        uVar8 = sVar9 + 1;
      }
      buf->size_ = uVar8;
      buf->ptr_[sVar9] = bVar10;
    }
    else {
      uVar12 = (ulong)uVar14;
      uVar8 = buf->capacity_;
      if (uVar8 < uVar12) {
        (*buf->grow_)(buf,uVar12);
        uVar8 = buf->capacity_;
      }
      if (uVar12 < uVar8) {
        uVar8 = uVar12;
      }
      buf->size_ = uVar8;
      if (uVar14 != 1) {
        uVar8 = 0;
        do {
          iVar13 = bigint::divmod_assign(&local_228,&local_2d0);
          buf->ptr_[uVar8] = (char)iVar13 + '0';
          bigint::multiply(&local_228,10);
          uVar8 = uVar8 + 1;
        } while (uVar11 != uVar8);
      }
      uVar6 = bigint::divmod_assign(&local_228,&local_2d0);
      iVar13 = add_compare(&local_228,&local_228,&local_2d0);
      if ((0 < iVar13) || ((uVar6 & 1) != 0 && iVar13 == 0)) {
        if (uVar6 == 9) {
          buf->ptr_[(int)uVar11] = ':';
          if (uVar14 != 1) {
            iVar13 = uVar14 + 1;
            do {
              uVar8 = uVar12 - 1 & 0xffffffff;
              if (buf->ptr_[uVar8] != ':') break;
              buf->ptr_[uVar8] = '0';
              buf->ptr_[uVar12 - 2] = buf->ptr_[uVar12 - 2] + '\x01';
              iVar13 = iVar13 + -1;
              uVar12 = uVar12 - 1;
            } while (2 < iVar13);
          }
          if (*buf->ptr_ == ':') {
            *buf->ptr_ = '1';
            if ((flags & 4) == 0) {
              *exp10 = *exp10 + 1;
            }
            else {
              sVar9 = buf->size_;
              uVar8 = sVar9 + 1;
              if (buf->capacity_ < uVar8) {
                (*buf->grow_)(buf,uVar8);
                sVar9 = buf->size_;
                uVar8 = sVar9 + 1;
              }
              buf->size_ = uVar8;
              buf->ptr_[sVar9] = '0';
            }
          }
          goto LAB_00449e1f;
        }
        uVar6 = uVar6 + 1;
      }
      buf->ptr_[(int)uVar11] = (char)uVar6 + '0';
    }
    goto LAB_00449e1f;
  }
  uVar16 = SUB84(buf->ptr_,0);
  uVar17 = (undefined4)((ulong)buf->ptr_ >> 0x20);
  lVar15 = 0;
  while( true ) {
    uVar14 = bigint::divmod_assign(&local_228,&local_2d0);
    iVar13 = compare(&local_228,&local_180);
    iVar7 = add_compare(&local_228,lhs2,&local_2d0);
    *(char *)(CONCAT44(uVar17,uVar16) + lVar15) = (char)uVar14 + '0';
    if ((iVar13 < (int)uVar11) || ((int)-uVar11 < iVar7)) break;
    bigint::multiply(&local_228,10);
    bigint::multiply(&local_180,10);
    if (this_00 != (bigint *)0x0) {
      bigint::multiply(this_00,10);
    }
    lVar15 = lVar15 + 1;
  }
  if (iVar13 < (int)uVar11) {
    if ((int)-uVar11 < iVar7) {
      iVar13 = add_compare(&local_228,&local_228,&local_2d0);
      if ((0 < iVar13) || ((uVar14 & 1) != 0 && iVar13 == 0)) goto LAB_00449d73;
    }
  }
  else {
LAB_00449d73:
    pcVar4 = (char *)(CONCAT44(uVar17,uVar16) + -1 + (lVar15 + 1U & 0xffffffff));
    *pcVar4 = *pcVar4 + '\x01';
  }
  uVar12 = lVar15 + 1U & 0xffffffff;
  uVar8 = buf->capacity_;
  if (uVar8 < uVar12) {
    (*buf->grow_)(buf,uVar12);
    uVar8 = buf->capacity_;
  }
  if (uVar12 < uVar8) {
    uVar8 = uVar12;
  }
  buf->size_ = uVar8;
  *exp10 = *exp10 - (int)lVar15;
LAB_00449e1f:
  if (local_d8.bigits_.super_buffer<unsigned_int>.ptr_ != puVar5) {
    free(local_d8.bigits_.super_buffer<unsigned_int>.ptr_);
  }
  if (local_180.bigits_.super_buffer<unsigned_int>.ptr_ != puVar3) {
    free(local_180.bigits_.super_buffer<unsigned_int>.ptr_);
  }
  if (local_2d0.bigits_.super_buffer<unsigned_int>.ptr_ != puVar2) {
    free(local_2d0.bigits_.super_buffer<unsigned_int>.ptr_);
  }
  if (local_228.bigits_.super_buffer<unsigned_int>.ptr_ != puVar1) {
    free(local_228.bigits_.super_buffer<unsigned_int>.ptr_);
  }
  return;
}

Assistant:

FMT_CONSTEXPR20 inline void format_dragon(basic_fp<uint128_t> value,
                                          unsigned flags, int num_digits,
                                          buffer<char>& buf, int& exp10) {
  bigint numerator;    // 2 * R in (FPP)^2.
  bigint denominator;  // 2 * S in (FPP)^2.
  // lower and upper are differences between value and corresponding boundaries.
  bigint lower;             // (M^- in (FPP)^2).
  bigint upper_store;       // upper's value if different from lower.
  bigint* upper = nullptr;  // (M^+ in (FPP)^2).
  // Shift numerator and denominator by an extra bit or two (if lower boundary
  // is closer) to make lower and upper integers. This eliminates multiplication
  // by 2 during later computations.
  bool is_predecessor_closer = (flags & dragon::predecessor_closer) != 0;
  int shift = is_predecessor_closer ? 2 : 1;
  if (value.e >= 0) {
    numerator = value.f;
    numerator <<= value.e + shift;
    lower = 1;
    lower <<= value.e;
    if (is_predecessor_closer) {
      upper_store = 1;
      upper_store <<= value.e + 1;
      upper = &upper_store;
    }
    denominator.assign_pow10(exp10);
    denominator <<= shift;
  } else if (exp10 < 0) {
    numerator.assign_pow10(-exp10);
    lower.assign(numerator);
    if (is_predecessor_closer) {
      upper_store.assign(numerator);
      upper_store <<= 1;
      upper = &upper_store;
    }
    numerator *= value.f;
    numerator <<= shift;
    denominator = 1;
    denominator <<= shift - value.e;
  } else {
    numerator = value.f;
    numerator <<= shift;
    denominator.assign_pow10(exp10);
    denominator <<= shift - value.e;
    lower = 1;
    if (is_predecessor_closer) {
      upper_store = 1ULL << 1;
      upper = &upper_store;
    }
  }
  int even = static_cast<int>((value.f & 1) == 0);
  if (!upper) upper = &lower;
  bool shortest = num_digits < 0;
  if ((flags & dragon::fixup) != 0) {
    if (add_compare(numerator, *upper, denominator) + even <= 0) {
      --exp10;
      numerator *= 10;
      if (num_digits < 0) {
        lower *= 10;
        if (upper != &lower) *upper *= 10;
      }
    }
    if ((flags & dragon::fixed) != 0) adjust_precision(num_digits, exp10 + 1);
  }
  // Invariant: value == (numerator / denominator) * pow(10, exp10).
  if (shortest) {
    // Generate the shortest representation.
    num_digits = 0;
    char* data = buf.data();
    for (;;) {
      int digit = numerator.divmod_assign(denominator);
      bool low = compare(numerator, lower) - even < 0;  // numerator <[=] lower.
      // numerator + upper >[=] pow10:
      bool high = add_compare(numerator, *upper, denominator) + even > 0;
      data[num_digits++] = static_cast<char>('0' + digit);
      if (low || high) {
        if (!low) {
          ++data[num_digits - 1];
        } else if (high) {
          int result = add_compare(numerator, numerator, denominator);
          // Round half to even.
          if (result > 0 || (result == 0 && (digit % 2) != 0))
            ++data[num_digits - 1];
        }
        buf.try_resize(to_unsigned(num_digits));
        exp10 -= num_digits - 1;
        return;
      }
      numerator *= 10;
      lower *= 10;
      if (upper != &lower) *upper *= 10;
    }
  }
  // Generate the given number of digits.
  exp10 -= num_digits - 1;
  if (num_digits <= 0) {
    auto digit = '0';
    if (num_digits == 0) {
      denominator *= 10;
      digit = add_compare(numerator, numerator, denominator) > 0 ? '1' : '0';
    }
    buf.push_back(digit);
    return;
  }
  buf.try_resize(to_unsigned(num_digits));
  for (int i = 0; i < num_digits - 1; ++i) {
    int digit = numerator.divmod_assign(denominator);
    buf[i] = static_cast<char>('0' + digit);
    numerator *= 10;
  }
  int digit = numerator.divmod_assign(denominator);
  auto result = add_compare(numerator, numerator, denominator);
  if (result > 0 || (result == 0 && (digit % 2) != 0)) {
    if (digit == 9) {
      const auto overflow = '0' + 10;
      buf[num_digits - 1] = overflow;
      // Propagate the carry.
      for (int i = num_digits - 1; i > 0 && buf[i] == overflow; --i) {
        buf[i] = '0';
        ++buf[i - 1];
      }
      if (buf[0] == overflow) {
        buf[0] = '1';
        if ((flags & dragon::fixed) != 0)
          buf.push_back('0');
        else
          ++exp10;
      }
      return;
    }
    ++digit;
  }
  buf[num_digits - 1] = static_cast<char>('0' + digit);
}